

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O0

adios2_error adios2_variable_min(void *min,adios2_variable *variable)

{
  DataType DVar1;
  string sVar2;
  undefined2 uVar3;
  DataType DVar4;
  undefined4 uVar5;
  DataType DVar6;
  undefined8 uVar7;
  ulong uVar8;
  long in_RSI;
  string *in_RDI;
  unkbyte10 in_ST0;
  undefined8 in_XMM1_Qa;
  Variable<std::complex<double>_> *variableT_14;
  complex<double> *minT_14;
  Variable<std::complex<float>_> *variableT_13;
  complex<float> *minT_13;
  Variable<long_double> *variableT_12;
  longdouble *minT_12;
  Variable<double> *variableT_11;
  double *minT_11;
  Variable<float> *variableT_10;
  float *minT_10;
  Variable<unsigned_long> *variableT_9;
  uint64_t *minT_9;
  Variable<unsigned_int> *variableT_8;
  uint32_t *minT_8;
  Variable<unsigned_short> *variableT_7;
  uint16_t *minT_7;
  Variable<unsigned_char> *variableT_6;
  uint8_t *minT_6;
  Variable<long> *variableT_5;
  int64_t *minT_5;
  Variable<int> *variableT_4;
  int32_t *minT_4;
  Variable<short> *variableT_3;
  int16_t *minT_3;
  Variable<signed_char> *variableT_2;
  int8_t *minT_2;
  Variable<char> *variableT_1;
  char *minT_1;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *variableT;
  string *minT;
  DataType type;
  VariableBase *variableBase;
  ulong local_3a0;
  ulong local_370;
  ulong local_350;
  ulong local_330;
  ulong local_318;
  string *in_stack_fffffffffffffd08;
  adios2_variable *in_stack_fffffffffffffd10;
  ulong local_2e0;
  ulong local_2c8;
  ulong local_2b0;
  ulong local_290;
  ulong local_278;
  ulong local_260;
  ulong local_248;
  ulong local_230;
  undefined8 local_210;
  string local_b8 [32];
  undefined8 local_98;
  string *local_90;
  DataType local_84;
  long local_80;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  long local_18;
  string *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,"for adios2_variable, in call to adios2_variable_min",&local_39);
  adios2::helper::CheckForNullptr<adios2_variable_const>
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"for void* min, in call to adios2_variable_min",&local_71);
  adios2::helper::CheckForNullptr<void>(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_80 = local_18;
  DVar1 = *(DataType *)(local_18 + 0x28);
  if (DVar1 != Struct) {
    local_84 = DVar1;
    DVar4 = adios2::helper::GetDataType<std::__cxx11::string>();
    DVar6 = local_84;
    if (DVar1 == DVar4) {
      local_90 = local_10;
      if (local_80 == 0) {
        local_210 = 0;
      }
      else {
        local_210 = __dynamic_cast(local_80,&adios2::core::VariableBase::typeinfo,
                                   &adios2::core::Variable<std::__cxx11::string>::typeinfo,0);
      }
      local_98 = local_210;
      adios2::core::Variable<std::__cxx11::string>::Min((ulong)local_b8);
      std::__cxx11::string::operator=(local_90,local_b8);
      std::__cxx11::string::~string(local_b8);
    }
    else {
      DVar4 = adios2::helper::GetDataType<char>();
      DVar1 = local_84;
      if (DVar6 == DVar4) {
        if (local_80 == 0) {
          local_230 = 0;
        }
        else {
          local_230 = __dynamic_cast(local_80,&adios2::core::VariableBase::typeinfo,
                                     &adios2::core::Variable<char>::typeinfo,0);
        }
        sVar2 = (string)adios2::core::Variable<char>::Min(local_230);
        *local_10 = sVar2;
      }
      else {
        DVar4 = adios2::helper::GetDataType<signed_char>();
        DVar6 = local_84;
        if (DVar1 == DVar4) {
          if (local_80 == 0) {
            local_248 = 0;
          }
          else {
            local_248 = __dynamic_cast(local_80,&adios2::core::VariableBase::typeinfo,
                                       &adios2::core::Variable<signed_char>::typeinfo,0);
          }
          sVar2 = (string)adios2::core::Variable<signed_char>::Min(local_248);
          *local_10 = sVar2;
        }
        else {
          DVar4 = adios2::helper::GetDataType<short>();
          DVar1 = local_84;
          if (DVar6 == DVar4) {
            if (local_80 == 0) {
              local_260 = 0;
            }
            else {
              local_260 = __dynamic_cast(local_80,&adios2::core::VariableBase::typeinfo,
                                         &adios2::core::Variable<short>::typeinfo,0);
            }
            uVar3 = adios2::core::Variable<short>::Min(local_260);
            *(undefined2 *)local_10 = uVar3;
          }
          else {
            DVar4 = adios2::helper::GetDataType<int>();
            DVar6 = local_84;
            if (DVar1 == DVar4) {
              if (local_80 == 0) {
                local_278 = 0;
              }
              else {
                local_278 = __dynamic_cast(local_80,&adios2::core::VariableBase::typeinfo,
                                           &adios2::core::Variable<int>::typeinfo,0);
              }
              uVar5 = adios2::core::Variable<int>::Min(local_278);
              *(undefined4 *)local_10 = uVar5;
            }
            else {
              DVar4 = adios2::helper::GetDataType<long>();
              DVar1 = local_84;
              if (DVar6 == DVar4) {
                if (local_80 == 0) {
                  local_290 = 0;
                }
                else {
                  local_290 = __dynamic_cast(local_80,&adios2::core::VariableBase::typeinfo,
                                             &adios2::core::Variable<long>::typeinfo,0);
                }
                uVar7 = adios2::core::Variable<long>::Min(local_290);
                *(undefined8 *)local_10 = uVar7;
              }
              else {
                DVar4 = adios2::helper::GetDataType<unsigned_char>();
                DVar6 = local_84;
                if (DVar1 == DVar4) {
                  if (local_80 == 0) {
                    local_2b0 = 0;
                  }
                  else {
                    local_2b0 = __dynamic_cast(local_80,&adios2::core::VariableBase::typeinfo,
                                               &adios2::core::Variable<unsigned_char>::typeinfo,0);
                  }
                  sVar2 = (string)adios2::core::Variable<unsigned_char>::Min(local_2b0);
                  *local_10 = sVar2;
                }
                else {
                  DVar4 = adios2::helper::GetDataType<unsigned_short>();
                  DVar1 = local_84;
                  if (DVar6 == DVar4) {
                    if (local_80 == 0) {
                      local_2c8 = 0;
                    }
                    else {
                      local_2c8 = __dynamic_cast(local_80,&adios2::core::VariableBase::typeinfo,
                                                 &adios2::core::Variable<unsigned_short>::typeinfo,0
                                                );
                    }
                    uVar3 = adios2::core::Variable<unsigned_short>::Min(local_2c8);
                    *(undefined2 *)local_10 = uVar3;
                  }
                  else {
                    DVar4 = adios2::helper::GetDataType<unsigned_int>();
                    DVar6 = local_84;
                    if (DVar1 == DVar4) {
                      if (local_80 == 0) {
                        local_2e0 = 0;
                      }
                      else {
                        local_2e0 = __dynamic_cast(local_80,&adios2::core::VariableBase::typeinfo,
                                                   &adios2::core::Variable<unsigned_int>::typeinfo,0
                                                  );
                      }
                      uVar5 = adios2::core::Variable<unsigned_int>::Min(local_2e0);
                      *(undefined4 *)local_10 = uVar5;
                    }
                    else {
                      DVar4 = adios2::helper::GetDataType<unsigned_long>();
                      DVar1 = local_84;
                      if (DVar6 == DVar4) {
                        if (local_80 == 0) {
                          uVar8 = 0;
                        }
                        else {
                          uVar8 = __dynamic_cast(local_80,&adios2::core::VariableBase::typeinfo,
                                                 &adios2::core::Variable<unsigned_long>::typeinfo,0)
                          ;
                        }
                        uVar7 = adios2::core::Variable<unsigned_long>::Min(uVar8);
                        *(undefined8 *)local_10 = uVar7;
                      }
                      else {
                        DVar4 = adios2::helper::GetDataType<float>();
                        DVar6 = local_84;
                        if (DVar1 == DVar4) {
                          if (local_80 == 0) {
                            local_318 = 0;
                          }
                          else {
                            local_318 = __dynamic_cast(local_80,&adios2::core::VariableBase::
                                                                 typeinfo,
                                                       &adios2::core::Variable<float>::typeinfo,0);
                          }
                          uVar5 = adios2::core::Variable<float>::Min(local_318);
                          *(undefined4 *)local_10 = uVar5;
                        }
                        else {
                          DVar4 = adios2::helper::GetDataType<double>();
                          DVar1 = local_84;
                          if (DVar6 == DVar4) {
                            if (local_80 == 0) {
                              local_330 = 0;
                            }
                            else {
                              local_330 = __dynamic_cast(local_80,&adios2::core::VariableBase::
                                                                   typeinfo,
                                                         &adios2::core::Variable<double>::typeinfo,0
                                                        );
                            }
                            uVar7 = adios2::core::Variable<double>::Min(local_330);
                            *(undefined8 *)local_10 = uVar7;
                          }
                          else {
                            DVar4 = adios2::helper::GetDataType<long_double>();
                            DVar6 = local_84;
                            if (DVar1 == DVar4) {
                              if (local_80 == 0) {
                                local_350 = 0;
                              }
                              else {
                                local_350 = __dynamic_cast(local_80,&adios2::core::VariableBase::
                                                                     typeinfo,
                                                           &adios2::core::Variable<long_double>::
                                                            typeinfo,0);
                              }
                              adios2::core::Variable<long_double>::Min(local_350);
                              *(unkbyte10 *)local_10 = in_ST0;
                            }
                            else {
                              DVar4 = adios2::helper::GetDataType<std::complex<float>>();
                              DVar1 = local_84;
                              if (DVar6 == DVar4) {
                                if (local_80 == 0) {
                                  local_370 = 0;
                                }
                                else {
                                  local_370 = __dynamic_cast(local_80,&adios2::core::VariableBase::
                                                                       typeinfo,
                                                             &adios2::core::
                                                              Variable<std::complex<float>>::
                                                              typeinfo,0);
                                }
                                uVar7 = adios2::core::Variable<std::complex<float>>::Min(local_370);
                                *(undefined8 *)local_10 = uVar7;
                              }
                              else {
                                DVar6 = adios2::helper::GetDataType<std::complex<double>>();
                                if (DVar1 == DVar6) {
                                  if (local_80 == 0) {
                                    local_3a0 = 0;
                                  }
                                  else {
                                    local_3a0 = __dynamic_cast(local_80,&adios2::core::VariableBase
                                                                         ::typeinfo,
                                                               &adios2::core::
                                                                Variable<std::complex<double>>::
                                                                typeinfo,0);
                                  }
                                  uVar7 = adios2::core::Variable<std::complex<double>>::Min
                                                    (local_3a0);
                                  *(undefined8 *)local_10 = uVar7;
                                  *(undefined8 *)(local_10 + 8) = in_XMM1_Qa;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_variable_min(void *min, const adios2_variable *variable)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call "
                                                  "to adios2_variable_min");
        adios2::helper::CheckForNullptr(min, "for void* min, in call to adios2_variable_min");

        const adios2::core::VariableBase *variableBase =
            reinterpret_cast<const adios2::core::VariableBase *>(variable);
        const adios2::DataType type(variableBase->m_Type);

        if (type == adios2::DataType::Struct)
        {
            // not supported
        }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        T *minT = reinterpret_cast<T *>(min);                                                      \
        const adios2::core::Variable<T> *variableT =                                               \
            dynamic_cast<const adios2::core::Variable<T> *>(variableBase);                         \
        *minT = variableT->Min(adios2::EngineCurrentStep);                                         \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_variable_min"));
    }
}